

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Get_Kerning(FT_Face face,FT_UInt left_glyph,FT_UInt right_glyph,FT_UInt kern_mode,
                       FT_Vector *akerning)

{
  FT_Driver pFVar1;
  FT_Face_GetKerningFunc p_Var2;
  FT_Size pFVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  FT_Error FVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  if (akerning == (FT_Vector *)0x0) {
    FVar6 = 6;
  }
  else {
    pFVar1 = face->driver;
    akerning->x = 0;
    akerning->y = 0;
    p_Var2 = pFVar1->clazz->get_kerning;
    if (p_Var2 != (FT_Face_GetKerningFunc)0x0) {
      FVar6 = (*p_Var2)(face,left_glyph,right_glyph,akerning);
      if (kern_mode == 2) {
        return FVar6;
      }
      if (FVar6 != 0) {
        return FVar6;
      }
      pFVar3 = face->size;
      lVar8 = (long)(int)(pFVar3->metrics).x_scale * (long)(int)akerning->x;
      lVar8 = (long)(int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
      akerning->x = lVar8;
      lVar11 = (long)(int)(pFVar3->metrics).y_scale * (long)(int)akerning->y;
      lVar11 = (long)(int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
      akerning->y = lVar11;
      if (kern_mode != 1) {
        uVar9 = (ulong)(pFVar3->metrics).x_ppem;
        lVar7 = lVar8;
        if (uVar9 < 0x19) {
          lVar7 = -lVar8;
          if (0 < lVar8) {
            lVar7 = lVar8;
          }
          auVar4._8_8_ = 0;
          auVar4._0_8_ = lVar7 * uVar9 + 0xc;
          lVar10 = SUB168(auVar4 * ZEXT816(0xa3d70a3d70a3d71),8);
          lVar7 = -lVar10;
          if (-1 < lVar8) {
            lVar7 = lVar10;
          }
        }
        uVar9 = (ulong)(pFVar3->metrics).y_ppem;
        lVar8 = lVar11;
        if (uVar9 < 0x19) {
          lVar8 = -lVar11;
          if (0 < lVar11) {
            lVar8 = lVar11;
          }
          auVar5._8_8_ = 0;
          auVar5._0_8_ = lVar8 * uVar9 + 0xc;
          lVar10 = SUB168(auVar5 * ZEXT816(0xa3d70a3d70a3d71),8);
          lVar8 = -lVar10;
          if (-1 < lVar11) {
            lVar8 = lVar10;
          }
        }
        akerning->x = lVar7 + 0x20U & 0xffffffffffffffc0;
        akerning->y = lVar8 + 0x20U & 0xffffffffffffffc0;
      }
    }
    FVar6 = 0;
  }
  return FVar6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Kerning( FT_Face     face,
                  FT_UInt     left_glyph,
                  FT_UInt     right_glyph,
                  FT_UInt     kern_mode,
                  FT_Vector  *akerning )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Driver  driver;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !akerning )
      return FT_THROW( Invalid_Argument );

    driver = face->driver;

    akerning->x = 0;
    akerning->y = 0;

    if ( driver->clazz->get_kerning )
    {
      error = driver->clazz->get_kerning( face,
                                          left_glyph,
                                          right_glyph,
                                          akerning );
      if ( !error )
      {
        if ( kern_mode != FT_KERNING_UNSCALED )
        {
          akerning->x = FT_MulFix( akerning->x, face->size->metrics.x_scale );
          akerning->y = FT_MulFix( akerning->y, face->size->metrics.y_scale );

          if ( kern_mode != FT_KERNING_UNFITTED )
          {
            FT_Pos  orig_x = akerning->x;
            FT_Pos  orig_y = akerning->y;


            /* we scale down kerning values for small ppem values */
            /* to avoid that rounding makes them too big.         */
            /* `25' has been determined heuristically.            */
            if ( face->size->metrics.x_ppem < 25 )
              akerning->x = FT_MulDiv( orig_x,
                                       face->size->metrics.x_ppem, 25 );
            if ( face->size->metrics.y_ppem < 25 )
              akerning->y = FT_MulDiv( orig_y,
                                       face->size->metrics.y_ppem, 25 );

            akerning->x = FT_PIX_ROUND( akerning->x );
            akerning->y = FT_PIX_ROUND( akerning->y );

#ifdef FT_DEBUG_LEVEL_TRACE
            {
              FT_Pos  orig_x_rounded = FT_PIX_ROUND( orig_x );
              FT_Pos  orig_y_rounded = FT_PIX_ROUND( orig_y );


              if ( akerning->x != orig_x_rounded ||
                   akerning->y != orig_y_rounded )
                FT_TRACE5(( "FT_Get_Kerning: horizontal kerning"
                            " (%ld, %ld) scaled down to (%ld, %ld) pixels\n",
                            orig_x_rounded / 64, orig_y_rounded / 64,
                            akerning->x / 64, akerning->y / 64 ));
            }
#endif
          }
        }
      }
    }

    return error;
  }